

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

void __thiscall
bssl::HPKETest_InvalidRecipientKey_Test::TestBody(HPKETest_InvalidRecipientKey_Test *this)

{
  bool bVar1;
  int iVar2;
  evp_hpke_key_st *key_00;
  EVP_HPKE_KEM *kem;
  char *message;
  char *in_R9;
  string local_100;
  AssertHelper local_e0;
  Message local_d8 [3];
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_HPKE_KEY key;
  uint8_t private_key [37];
  HPKETest_InvalidRecipientKey_Test *this_local;
  
  key.ctx_.public_key[0x40] = 0xff;
  key.ctx_._105_7_ = 0;
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  key_00 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar_.message_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_init(key_00,kem,key.ctx_.public_key + 0x40,0x25);
  local_b9 = iVar2 == 0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_b8,
               (AssertionResult *)
               "EVP_HPKE_KEY_init(key.get(), EVP_hpke_x25519_hkdf_sha256(), private_key, sizeof(private_key))"
               ,"true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x282,message);
    testing::internal::AssertHelper::operator=(&local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(HPKETest, InvalidRecipientKey) {
  const uint8_t private_key[X25519_PUBLIC_VALUE_LEN + 5] = {0xff};
  ScopedEVP_HPKE_KEY key;
  EXPECT_FALSE(EVP_HPKE_KEY_init(key.get(), EVP_hpke_x25519_hkdf_sha256(),
                                 private_key, sizeof(private_key)));
}